

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

void __thiscall absl::Cord::RemovePrefix(Cord *this,size_t n)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  uint8_t uVar4;
  ulong uVar5;
  CordzInfo *this_00;
  CordRepBtree *pCVar6;
  ulong uVar7;
  size_t sVar8;
  AlphaNum *in_R9;
  CordRepBtree *pCVar9;
  CordRep *old;
  CordRepBtree *this_01;
  string death_message;
  CordRepBtree *local_130;
  char *local_128;
  string local_100;
  string local_e0 [32];
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  uVar5 = (ulong)(char)bVar3;
  if ((uVar5 & 1) == 0) {
    uVar7 = uVar5 >> 1;
  }
  else {
    uVar7 = ((this->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar7 < n) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_e0,"Check n <= size() failed: ",(allocator<char> *)&local_130);
    local_130 = (CordRepBtree *)0x16;
    local_128 = "Requested prefix size ";
    AlphaNum::AlphaNum(&local_60,n);
    local_90.piece_._M_len = 0x15;
    local_90.piece_._M_str = " exceeds Cord\'s size ";
    sVar8 = size(this);
    AlphaNum::AlphaNum(&local_c0,sVar8);
    StrCat_abi_cxx11_(&local_100,(absl *)&local_130,&local_60,&local_90,&local_c0,in_R9);
    std::__cxx11::string::operator+=(local_e0,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    (*(code *)raw_log_internal::internal_log_function_abi_cxx11_)
              (3,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
               ,0x2a6,local_e0);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.cc"
                  ,0x2a6,"void absl::Cord::RemovePrefix(size_t)");
  }
  this_01 = (CordRepBtree *)(this->contents_).data_.rep_.field_0.as_tree.rep;
  if ((this_01 != (CordRepBtree *)0x0 && (bVar3 & 1) != 0) && ((this_01->super_CordRep).length == 0)
     ) {
    RemovePrefix();
LAB_00130d46:
    InlineRep::remove_prefix(&this->contents_,n);
    return;
  }
  if (this_01 == (CordRepBtree *)0x0 || (uVar5 & 1) == 0) goto LAB_00130d46;
  this_00 = cord_internal::InlineData::cordz_info((InlineData *)this);
  if (this_00 != (CordzInfo *)0x0) {
    cord_internal::CordzInfo::Lock(this_00,kRemovePrefix);
  }
  if ((this_01->super_CordRep).tag == '\x02') {
    RemovePrefix();
    this_01 = local_130;
  }
  uVar5 = (this_01->super_CordRep).length;
  if (uVar5 < n || uVar5 - n == 0) {
    LOCK();
    pRVar1 = &(this_01->super_CordRep).refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) goto LAB_00131055;
    if (uVar2 == 2) {
      cord_internal::CordRep::Destroy(&this_01->super_CordRep);
    }
    pCVar6 = (CordRepBtree *)0x0;
    goto LAB_00130e9b;
  }
  uVar4 = (this_01->super_CordRep).tag;
  pCVar6 = this_01;
  if (uVar4 == '\x01') {
    if ((this_01->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) {
      if ((this_01->super_CordRep).tag != '\x01') {
        __assert_fail("IsSubstring()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x35b,"CordRepSubstring *absl::cord_internal::CordRep::substring()");
      }
      this_01->edges_[0] = (CordRep *)(this_01->edges_[0]->storage + (n - 0xd));
      (this_01->super_CordRep).length = (this_01->super_CordRep).length - n;
      goto LAB_00130e9b;
    }
    uVar5 = (this_01->super_CordRep).length;
LAB_00130e02:
    sVar8 = uVar5 - n;
    if (sVar8 == 0) {
      __assert_fail("n != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a3,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (uVar5 < n || sVar8 == 0) {
      __assert_fail("pos < rep->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x1a4,
                    "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                   );
    }
    if (n == 0) {
      LOCK();
      pRVar1 = &(this_01->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
    }
    else {
      pCVar9 = this_01;
      if ((this_01->super_CordRep).tag == '\x01') {
        n = (size_t)(this_01->edges_[0]->storage + (n - 0xd));
        pCVar9 = (CordRepBtree *)this_01->edges_[1];
      }
      pCVar6 = (CordRepBtree *)operator_new(0x20);
      (pCVar6->super_CordRep).length = 0;
      (pCVar6->super_CordRep).refcount = (atomic<int>)0x0;
      (pCVar6->super_CordRep).tag = '\0';
      (pCVar6->super_CordRep).storage[0] = '\0';
      (pCVar6->super_CordRep).storage[1] = '\0';
      (pCVar6->super_CordRep).storage[2] = '\0';
      (pCVar6->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
      (pCVar6->super_CordRep).length = sVar8;
      (pCVar6->super_CordRep).tag = '\x01';
      pCVar6->edges_[0] = (CordRep *)n;
      if (pCVar9 == (CordRepBtree *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                      ,0x371,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
      }
      LOCK();
      pRVar1 = &(pCVar9->super_CordRep).refcount;
      (pRVar1->count_).super___atomic_base<int>._M_i =
           (pRVar1->count_).super___atomic_base<int>._M_i + 2;
      UNLOCK();
      pCVar6->edges_[1] = &pCVar9->super_CordRep;
    }
  }
  else {
    if (uVar4 != '\x03') goto LAB_00130e02;
    pCVar6 = (CordRepBtree *)cord_internal::CordRepBtree::SubTree(this_01,n,uVar5 - n);
  }
  LOCK();
  pRVar1 = &(this_01->super_CordRep).refcount;
  uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
  (pRVar1->count_).super___atomic_base<int>._M_i =
       (pRVar1->count_).super___atomic_base<int>._M_i + -2;
  UNLOCK();
  if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
LAB_00131055:
    __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0xaa,"bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()")
    ;
  }
  if (uVar2 == 2) {
    cord_internal::CordRep::Destroy(&this_01->super_CordRep);
  }
LAB_00130e9b:
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) == 0) {
    __assert_fail("data_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/cord.h"
                  ,0x4e7,
                  "void absl::Cord::InlineRep::SetTreeOrEmpty(absl::Nullable<CordRep *>, const CordzUpdateScope &)"
                 );
  }
  if (pCVar6 == (CordRepBtree *)0x0) {
    (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  }
  else {
    (this->contents_).data_.rep_.field_0.as_tree.rep = &pCVar6->super_CordRep;
  }
  if (this_00 != (CordzInfo *)0x0) {
    Mutex::AssertHeld(&this_00->mutex_);
    this_00->rep_ = &pCVar6->super_CordRep;
    cord_internal::CordzInfo::Unlock(this_00);
    return;
  }
  return;
}

Assistant:

void Cord::RemovePrefix(size_t n) {
  ABSL_INTERNAL_CHECK(n <= size(),
                      absl::StrCat("Requested prefix size ", n,
                                   " exceeds Cord's size ", size()));
  contents_.MaybeRemoveEmptyCrcNode();
  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    contents_.remove_prefix(n);
  } else {
    auto constexpr method = CordzUpdateTracker::kRemovePrefix;
    CordzUpdateScope scope(contents_.cordz_info(), method);
    tree = cord_internal::RemoveCrcNode(tree);
    if (n >= tree->length) {
      CordRep::Unref(tree);
      tree = nullptr;
    } else if (tree->IsBtree()) {
      CordRep* old = tree;
      tree = tree->btree()->SubTree(n, tree->length - n);
      CordRep::Unref(old);
    } else if (tree->IsSubstring() && tree->refcount.IsOne()) {
      tree->substring()->start += n;
      tree->length -= n;
    } else {
      CordRep* rep = CordRepSubstring::Substring(tree, n, tree->length - n);
      CordRep::Unref(tree);
      tree = rep;
    }
    contents_.SetTreeOrEmpty(tree, scope);
  }
}